

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_rescue(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *victim;
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  char *txt;
  char arg [4608];
  char local_1228 [4608];
  
  one_argument(argument,local_1228);
  if (local_1228[0] == '\0') {
    txt = "Rescue whom?\n\r";
  }
  else {
    ch_00 = get_char_room(ch,local_1228);
    if (ch_00 == (CHAR_DATA *)0x0) {
      txt = "They aren\'t here.\n\r";
    }
    else if (ch_00 == ch) {
      txt = "What about fleeing instead?\n\r";
    }
    else {
      bVar1 = is_npc(ch);
      if ((bVar1) || (bVar1 = is_npc(ch_00), !bVar1)) {
        victim = ch_00->fighting;
        if (victim != (CHAR_DATA *)0x0) {
          bVar1 = is_safe_new(ch,victim,true);
          if (bVar1) {
            return;
          }
          WAIT_STATE(ch,(int)skill_table[gsn_rescue].beats);
          iVar2 = number_percent();
          iVar3 = get_skill(ch,(int)gsn_rescue);
          if (iVar3 < iVar2) {
            send_to_char("You fail the rescue.\n\r",ch);
            check_improve(ch,(int)gsn_rescue,false,1);
            return;
          }
          LAG_CHAR(ch_00,0xc);
          act("You rescue $N!",ch,(void *)0x0,ch_00,3);
          act("$n rescues you!",ch,(void *)0x0,ch_00,2);
          act("$n rescues $N!",ch,(void *)0x0,ch_00,1);
          check_improve(ch,(int)gsn_rescue,true,1);
          stop_fighting(victim,false);
          stop_fighting(ch_00,false);
          set_fighting(ch,victim);
          set_fighting(victim,ch);
          return;
        }
        txt = "That person is not fighting right now.\n\r";
      }
      else {
        txt = "Doesn\'t need your help!\n\r";
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_rescue(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	CHAR_DATA *fch;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Rescue whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("What about fleeing instead?\n\r", ch);
		return;
	}

	if (!is_npc(ch) && is_npc(victim))
	{
		send_to_char("Doesn't need your help!\n\r", ch);
		return;
	}

	fch = victim->fighting;

	if (fch == nullptr)
	{
		send_to_char("That person is not fighting right now.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim->fighting))
		return;

	WAIT_STATE(ch, skill_table[gsn_rescue].beats);

	if (number_percent() > get_skill(ch, gsn_rescue))
	{
		send_to_char("You fail the rescue.\n\r", ch);
		check_improve(ch, gsn_rescue, false, 1);
		return;
	}

	LAG_CHAR(victim, PULSE_VIOLENCE);
	act("You rescue $N!", ch, nullptr, victim, TO_CHAR);
	act("$n rescues you!", ch, nullptr, victim, TO_VICT);
	act("$n rescues $N!", ch, nullptr, victim, TO_NOTVICT);
	check_improve(ch, gsn_rescue, true, 1);

	stop_fighting(fch, false);
	stop_fighting(victim, false);

	set_fighting(ch, fch);
	set_fighting(fch, ch);
}